

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fctkern__log_test_start(fctkern_t *nk,fct_test_t *test)

{
  fct_logger_i *logger_00;
  long in_RSI;
  long in_RDI;
  fct_logger_i *logger;
  size_t num_itemslogger;
  size_t item_ilogger;
  fct_test_t *in_stack_ffffffffffffffd8;
  fct_logger_i *local_18;
  
  if (in_RDI == 0) {
    __assert_fail("nk != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcherednik[P]libgha/src/3rd/fctx/fct.h"
                  ,0x967,"void fctkern__log_test_start(fctkern_t *, const fct_test_t *)");
  }
  if (in_RSI == 0) {
    __assert_fail("test != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcherednik[P]libgha/src/3rd/fctx/fct.h"
                  ,0x968,"void fctkern__log_test_start(fctkern_t *, const fct_test_t *)");
  }
  if (in_RDI != -0x198) {
    logger_00 = (fct_logger_i *)fct_nlist__size((fct_nlist_t *)0x102df2);
    for (local_18 = (fct_logger_i *)0x0; local_18 != logger_00;
        local_18 = (fct_logger_i *)((long)&(local_18->vtable).on_chk + 1)) {
      in_stack_ffffffffffffffd8 =
           (fct_test_t *)fct_nlist__at((fct_nlist_t *)logger_00,(size_t)in_stack_ffffffffffffffd8);
      fct_logger__on_test_start(logger_00,in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

static void
fctkern__log_test_start(fctkern_t *nk, fct_test_t const *test)
{
    FCT_ASSERT( nk != NULL );
    FCT_ASSERT( test != NULL );
    FCT_NLIST_FOREACH_BGN(fct_logger_i*, logger, &(nk->logger_list))
    {
        fct_logger__on_test_start(logger, test);
    }
    FCT_NLIST_FOREACH_END();
}